

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTypes::visit(SemanticTypes *this,CallNode *callNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TokenNode *pTVar4;
  PointerNode *pPVar5;
  ExpNode *pEVar6;
  ArrayNode *pAVar7;
  int iVar8;
  FunctionSymbol *pFVar9;
  ExpListNode *pEVar10;
  FormalListNode *pFVar11;
  bool bVar12;
  bool bVar13;
  
  pTVar4 = callNode->id;
  if (pTVar4 == (TokenNode *)0x0) {
    visit((SemanticTypes *)callNode);
  }
  else {
    (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar4,this);
    pEVar10 = callNode->parameters;
    if (pEVar10 != (ExpListNode *)0x0) {
      (*(pEVar10->super_ASTNode)._vptr_ASTNode[3])(pEVar10,this);
    }
    pFVar9 = FunctionTable::cSearch(functionTable,(callNode->id->super_ExpNode).lexeme);
    if (pFVar9 == (FunctionSymbol *)0x0) {
      visit();
    }
    else {
      pFVar11 = pFVar9->varDecl;
      pEVar10 = callNode->parameters;
      bVar12 = pFVar11 != (FormalListNode *)0x0;
      bVar13 = pEVar10 != (ExpListNode *)0x0;
      if (bVar12 && bVar13) {
        do {
          (*(pEVar10->super_ASTNode)._vptr_ASTNode[3])(pEVar10,this);
          pPVar5 = pFVar11->pointer;
          pTVar4 = pFVar11->type->id;
          iVar1 = pTVar4->token;
          pEVar6 = pEVar10->exp;
          iVar2 = pEVar6->type;
          pAVar7 = pFVar11->array;
          iVar3 = pEVar6->arraySize;
          bVar13 = pEVar6->pointer;
          if (iVar1 == 10) {
            iVar8 = strcmp((pTVar4->super_ExpNode).typeLexeme,pEVar6->typeLexeme);
            bVar12 = iVar8 != 0;
          }
          else {
            bVar12 = false;
          }
          if ((((iVar1 != iVar2) || ((pAVar7 != (ArrayNode *)0x0) != 0 < iVar3)) ||
              ((pPVar5 != (PointerNode *)0x0) != bVar13)) || (bVar12)) {
            visit();
            return;
          }
          pFVar11 = pFVar11->next;
          pEVar10 = pEVar10->next;
          bVar13 = pEVar10 != (ExpListNode *)0x0;
          bVar12 = pFVar11 != (FormalListNode *)0x0;
        } while ((bVar12) && (pEVar10 != (ExpListNode *)0x0));
      }
      if ((bVar12) || (bVar13)) {
        visit();
      }
      else {
        if ((activeFunction != (FunctionSymbol *)0x0) &&
           (activeFunction->callSize < pFVar9->paramSize)) {
          activeFunction->callSize = pFVar9->paramSize;
        }
        (callNode->super_ExpNode).lexeme = (callNode->id->super_ExpNode).lexeme;
        pTVar4 = pFVar9->returnType->id;
        (callNode->super_ExpNode).type = pTVar4->token;
        (callNode->super_ExpNode).typeLexeme = (pTVar4->super_ExpNode).typeLexeme;
        (callNode->super_ExpNode).pointer = pFVar9->pointer;
        (callNode->super_ExpNode).arraySize = -1;
        (callNode->super_ExpNode).lValue = false;
      }
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(CallNode *callNode) {

    if (callNode->getId()) {
        callNode->getId()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] INVALID FUNCTION CALL, line %d\n", callNode->getLine());
        return;
    }

    if (callNode->getParameters()) {
        callNode->getParameters()->accept(this);
    }

    FunctionSymbol *func = functionTable->cSearch(callNode->getId()->getLexeme());

    if (!func) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] CALL TO UNDEFINED FUNCTION, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    FormalListNode *expectedParameter = func->getVarDecl();
    ExpListNode *parameter = callNode->getParameters();

    while (expectedParameter && parameter) {

        parameter->accept(this);

        bool isSameType = expectedParameter->getParameterType() == parameter->getExp()->getType();
        bool isSameArray = (expectedParameter->getArray() != NULL) == (parameter->getExp()->getArraySize() > 0);
        bool isSamePointer = (expectedParameter->getPointer() != NULL) == parameter->getExp()->isPointer();
        bool isSameTypeLexeme = true;

        if (expectedParameter->getParameterType() == ID)
            isSameTypeLexeme = !strcmp(expectedParameter->getParameterTypeLexeme(),
                                       parameter->getExp()->getTypeLexeme());

        if (!(isSameArray && isSamePointer && isSameType && isSameTypeLexeme)) {
            fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER TYPE MISMATCH, line: %d parameter: %s\n",
                    parameter->getLine(), expectedParameter->getId()->getLexeme());
            return;
        }

        parameter = parameter->getNext();
        expectedParameter = expectedParameter->getNext();
    }

    if (expectedParameter || parameter) {
        fprintf(stderr, "[SEMANTIC ERROR - callNode] PARAMETER COUNT MISMATCH, line: %d lexeme: %s\n",
                callNode->getLine(), callNode->getId()->getLexeme());
        return;
    }

    //Inform the caller the needed params size
    if(activeFunction) {
        activeFunction->setCallSize(func->getParamSize());
    }

    callNode->setLexeme(callNode->getId()->getLexeme());
    callNode->setType(func->getReturnType()->getType());
    callNode->setTypeLexeme(func->getReturnType()->getTypeLexeme());
    callNode->setPointer(func->isPointer());
    callNode->setArraySize(-1);
    callNode->setLValue(false);
}